

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422ToAR30Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *rgb_buf,
                    YuvConstants *yuvconstants,int width)

{
  uint8_t *puVar1;
  int iVar2;
  undefined4 in_register_0000008c;
  long lVar3;
  int r;
  int g;
  int b;
  int local_74;
  int local_70;
  int local_6c;
  uint8_t *local_68;
  int local_60;
  int local_5c;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  YuvConstants *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_0000008c,width);
  local_60 = width + -1;
  lVar3 = 0;
  iVar2 = 0;
  local_68 = rgb_buf;
  local_58 = src_y;
  local_50 = src_u;
  local_48 = src_v;
  local_40 = yuvconstants;
  while (iVar2 < local_60) {
    local_5c = iVar2;
    libyuv::YuvPixel8_16
              (src_y[lVar3 * 2],src_u[lVar3],src_v[lVar3],&local_6c,&local_70,&local_74,yuvconstants
              );
    puVar1 = local_68;
    libyuv::StoreAR30(local_68,local_6c,local_70,local_74);
    libyuv::YuvPixel8_16
              (src_y[lVar3 * 2 + 1],src_u[lVar3],src_v[lVar3],&local_6c,&local_70,&local_74,
               yuvconstants);
    libyuv::StoreAR30(puVar1 + 4,local_6c,local_70,local_74);
    local_68 = puVar1 + 8;
    lVar3 = lVar3 + 1;
    iVar2 = local_5c + 2;
  }
  if ((local_38 & 1) == 0) {
    return;
  }
  libyuv::YuvPixel8_16
            (local_58[lVar3 * 2],local_50[lVar3],local_48[lVar3],&local_6c,&local_70,&local_74,
             local_40);
  libyuv::StoreAR30(local_68,local_6c,local_70,local_74);
  return;
}

Assistant:

void I422ToAR30Row_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  int b;
  int g;
  int r;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel8_16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
    YuvPixel8_16(src_y[1], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf + 4, b, g, r);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel8_16(src_y[0], src_u[0], src_v[0], &b, &g, &r, yuvconstants);
    StoreAR30(rgb_buf, b, g, r);
  }
}